

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Prog * __thiscall re2::Compiler::Finish(Compiler *this)

{
  Prog *pPVar1;
  Inst *pIVar2;
  Inst *pIVar3;
  int64_t iVar4;
  long lVar5;
  
  if (this->failed_ == false) {
    pPVar1 = this->prog_;
    if ((pPVar1->start_ == 0) && (pPVar1->start_unanchored_ == 0)) {
      this->ninst_ = 1;
    }
    pIVar2 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    (this->inst_).ptr_._M_t.
    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl = (Inst *)0x0;
    pIVar3 = (pPVar1->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    (pPVar1->inst_).ptr_._M_t.
    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl = pIVar2;
    if (pIVar3 != (Inst *)0x0) {
      operator_delete(pIVar3);
    }
    (pPVar1->inst_).ptr_._M_t.
    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> =
         (Deleter)(this->inst_).ptr_._M_t.
                  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                  .super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>;
    pPVar1 = this->prog_;
    pPVar1->size_ = this->ninst_;
    Prog::Optimize(pPVar1);
    Prog::Flatten(this->prog_);
    Prog::ComputeByteMap(this->prog_);
    pPVar1 = this->prog_;
    if (this->max_mem_ < 1) {
      iVar4 = 0x100000;
    }
    else {
      lVar5 = (long)pPVar1->size_ * -2;
      if ((pPVar1->list_heads_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
          super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl == (unsigned_short *)0x0) {
        lVar5 = 0;
      }
      lVar5 = this->max_mem_ + (long)pPVar1->size_ * -8 + lVar5 + -0x1a0;
      iVar4 = 0;
      if (0 < lVar5) {
        iVar4 = lVar5;
      }
    }
    pPVar1->dfa_mem_ = iVar4;
    this->prog_ = (Prog *)0x0;
    return pPVar1;
  }
  return (Prog *)0x0;
}

Assistant:

Prog* Compiler::Finish() {
  if (failed_)
    return NULL;

  if (prog_->start() == 0 && prog_->start_unanchored() == 0) {
    // No possible matches; keep Fail instruction only.
    ninst_ = 1;
  }

  // Hand off the array to Prog.
  prog_->inst_ = std::move(inst_);
  prog_->size_ = ninst_;

  prog_->Optimize();
  prog_->Flatten();
  prog_->ComputeByteMap();

  // Record remaining memory for DFA.
  if (max_mem_ <= 0) {
    prog_->set_dfa_mem(1<<20);
  } else {
    int64_t m = max_mem_ - sizeof(Prog);
    m -= prog_->size_*sizeof(Prog::Inst);  // account for inst_
    if (prog_->CanBitState())
      m -= prog_->size_*sizeof(uint16_t);  // account for list_heads_
    if (m < 0)
      m = 0;
    prog_->set_dfa_mem(m);
  }

  Prog* p = prog_;
  prog_ = NULL;
  return p;
}